

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

PtrTokenOrSyntax * __thiscall
slang::syntax::LibraryIncDirClauseSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,LibraryIncDirClauseSyntax *this,size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  if (this == (LibraryIncDirClauseSyntax *)0x2) {
    return __return_storage_ptr__ + 4;
  }
  if (this == (LibraryIncDirClauseSyntax *)0x1) {
    pPVar1 = __return_storage_ptr__ + 2;
  }
  else {
    if (this != (LibraryIncDirClauseSyntax *)0x0) {
      return (PtrTokenOrSyntax *)0x0;
    }
    pPVar1 = __return_storage_ptr__ + 1;
  }
  return (PtrTokenOrSyntax *)
         (__index_type *)
         ((long)&(pPVar1->super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>).
                 super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                 super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                 super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                 super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> + 8);
}

Assistant:

PtrTokenOrSyntax LibraryIncDirClauseSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &minus;
        case 1: return &incdir;
        case 2: return &filePaths;
        default: return nullptr;
    }
}